

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O3

shared_ptr<Type> __thiscall Rel::check(Rel *this,shared_ptr<Type> *p1,shared_ptr<Type> *p2)

{
  element_type *peVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long *in_RCX;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  shared_ptr<Type> sVar7;
  
  peVar1 = (p2->super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    bVar4 = false;
  }
  else {
    auVar6 = __dynamic_cast(peVar1,&Type::typeinfo,&Array::typeinfo,0);
    p2 = auVar6._8_8_;
    bVar4 = auVar6._0_8_ != 0;
  }
  peVar2 = (element_type *)*in_RCX;
  if (peVar2 == (element_type *)0x0) {
    bVar5 = false;
  }
  else {
    auVar6 = __dynamic_cast(peVar2,&Type::typeinfo,&Array::typeinfo,0);
    p2 = auVar6._8_8_;
    bVar5 = auVar6._0_8_ != 0;
  }
  if (((bool)(bVar4 | bVar5)) || (peVar1 != peVar2)) {
    (this->super_Logical).super_Expr.super_Node._vptr_Node = (_func_int **)0x0;
    *(undefined8 *)&(this->super_Logical).super_Expr.super_Node.lexline = 0;
  }
  else {
    (this->super_Logical).super_Expr.super_Node._vptr_Node =
         (_func_int **)Type::Bool.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var3 = Type::Bool.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     &(this->super_Logical).super_Expr.super_Node.lexline =
         Type::Bool.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var3._M_pi)->_M_use_count = (_Var3._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var3._M_pi)->_M_use_count = (_Var3._M_pi)->_M_use_count + 1;
      }
    }
  }
  sVar7.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p2;
  sVar7.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Type>)sVar7.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Type> check(std::shared_ptr<Type> p1, std::shared_ptr<Type> p2) override {
		Array* arr_left = dynamic_cast<Array*>(p1.get());
		Array* arr_right = dynamic_cast<Array*>(p2.get());
		if (arr_left || arr_right) return nullptr;
		else if (p1 == p2) return Type::Bool;
		else return nullptr;
	}